

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  _xmlNode *p_Var1;
  xmlXPathParserContextPtr ctxt_00;
  int iVar2;
  int iVar3;
  xmlXPathObjectPtr value;
  int local_40;
  int local_3c;
  int i;
  int ret;
  xmlChar *lang;
  xmlChar *theLang;
  xmlNodePtr cur;
  xmlXPathObjectPtr val;
  xmlXPathParserContextPtr pxStack_10;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  local_3c = 0;
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    val._4_4_ = nargs;
    pxStack_10 = ctxt;
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        if ((pxStack_10->value == (xmlXPathObjectPtr)0x0) ||
           (pxStack_10->value->type != XPATH_STRING)) {
          xmlXPathErr(pxStack_10,0xb);
        }
        else {
          cur = (xmlNodePtr)xmlXPathValuePop(pxStack_10);
          p_Var1 = cur->last;
          for (theLang = (xmlChar *)pxStack_10->context->node; theLang != (xmlChar *)0x0;
              theLang = *(xmlChar **)(theLang + 0x28)) {
            iVar2 = xmlNodeGetAttrValue((xmlNode *)theLang,"lang",
                                        (xmlChar *)"http://www.w3.org/XML/1998/namespace",&lang);
            if (iVar2 < 0) {
              xmlXPathPErrMemory(pxStack_10);
            }
            if (lang != (xmlChar *)0x0) break;
          }
          if ((lang != (xmlChar *)0x0) && (p_Var1 != (_xmlNode *)0x0)) {
            for (local_40 = 0; *(xmlChar *)((long)&p_Var1->_private + (long)local_40) != '\0';
                local_40 = local_40 + 1) {
              iVar2 = toupper((uint)*(byte *)((long)&p_Var1->_private + (long)local_40));
              iVar3 = toupper((uint)lang[local_40]);
              if (iVar2 != iVar3) goto LAB_00228a01;
            }
            if ((lang[local_40] == '\0') || (lang[local_40] == '-')) {
              local_3c = 1;
            }
          }
LAB_00228a01:
          if (lang != (xmlChar *)0x0) {
            (*xmlFree)(lang);
          }
          xmlXPathReleaseObject(pxStack_10->context,(xmlXPathObjectPtr)cur);
          ctxt_00 = pxStack_10;
          value = xmlXPathCacheNewBoolean(pxStack_10,local_3c);
          xmlXPathValuePush(ctxt_00,value);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val;
    xmlNodePtr cur;
    xmlChar *theLang;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = xmlXPathValuePop(ctxt);
    lang = val->stringval;
    cur = ctxt->context->node;
    while (cur != NULL) {
        if (xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                &theLang) < 0)
            xmlXPathPErrMemory(ctxt);
        if (theLang != NULL)
            break;
        cur = cur->parent;
    }
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
            if (toupper(lang[i]) != toupper(theLang[i]))
                goto not_equal;
        if ((theLang[i] == 0) || (theLang[i] == '-'))
            ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
}